

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfMultiPartOutputFile.cpp
# Opt level: O1

TiledOutputFile * __thiscall
Imf_2_5::MultiPartOutputFile::getOutputPart<Imf_2_5::TiledOutputFile>
          (MultiPartOutputFile *this,int partNumber)

{
  _Rb_tree_header *p_Var1;
  pthread_mutex_t *__mutex;
  Data *pDVar2;
  int iVar3;
  mapped_type *ppGVar4;
  TiledOutputFile *this_00;
  _Base_ptr p_Var5;
  _Base_ptr p_Var6;
  int local_34;
  pair<int,_Imf_2_5::GenericOutputFile_*> local_30;
  
  __mutex = (pthread_mutex_t *)this->_data;
  local_34 = partNumber;
  iVar3 = pthread_mutex_lock(__mutex);
  if (iVar3 == 0) {
    pDVar2 = this->_data;
    p_Var1 = &(pDVar2->_outputFiles)._M_t._M_impl.super__Rb_tree_header;
    p_Var6 = (pDVar2->_outputFiles)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    p_Var5 = &p_Var1->_M_header;
    for (; p_Var6 != (_Base_ptr)0x0; p_Var6 = (&p_Var6->_M_left)[(int)p_Var6[1]._M_color < local_34]
        ) {
      if (local_34 <= (int)p_Var6[1]._M_color) {
        p_Var5 = p_Var6;
      }
    }
    p_Var6 = &p_Var1->_M_header;
    if (((_Rb_tree_header *)p_Var5 != p_Var1) &&
       (p_Var6 = p_Var5, local_34 < (int)p_Var5[1]._M_color)) {
      p_Var6 = &p_Var1->_M_header;
    }
    if ((_Rb_tree_header *)p_Var6 == p_Var1) {
      this_00 = (TiledOutputFile *)operator_new(0x20);
      TiledOutputFile::TiledOutputFile
                (this_00,(pDVar2->parts).
                         super__Vector_base<Imf_2_5::OutputPartData_*,_std::allocator<Imf_2_5::OutputPartData_*>_>
                         ._M_impl.super__Vector_impl_data._M_start[local_34]);
      local_30.first = local_34;
      local_30.second = (GenericOutputFile *)this_00;
      std::
      _Rb_tree<int,std::pair<int_const,Imf_2_5::GenericOutputFile*>,std::_Select1st<std::pair<int_const,Imf_2_5::GenericOutputFile*>>,std::less<int>,std::allocator<std::pair<int_const,Imf_2_5::GenericOutputFile*>>>
      ::_M_emplace_unique<std::pair<int,Imf_2_5::GenericOutputFile*>>
                ((_Rb_tree<int,std::pair<int_const,Imf_2_5::GenericOutputFile*>,std::_Select1st<std::pair<int_const,Imf_2_5::GenericOutputFile*>>,std::less<int>,std::allocator<std::pair<int_const,Imf_2_5::GenericOutputFile*>>>
                  *)&this->_data->_outputFiles,&local_30);
    }
    else {
      ppGVar4 = std::
                map<int,_Imf_2_5::GenericOutputFile_*,_std::less<int>,_std::allocator<std::pair<const_int,_Imf_2_5::GenericOutputFile_*>_>_>
                ::operator[](&pDVar2->_outputFiles,&local_34);
      this_00 = (TiledOutputFile *)*ppGVar4;
    }
    pthread_mutex_unlock(__mutex);
    return this_00;
  }
  std::__throw_system_error(iVar3);
}

Assistant:

T*
MultiPartOutputFile::getOutputPart(int partNumber)
{
    Lock lock(*_data);
    if (_data->_outputFiles.find(partNumber) == _data->_outputFiles.end())
    {
        T* file = new T(_data->parts[partNumber]);
        _data->_outputFiles.insert(std::make_pair(partNumber, (GenericOutputFile*) file));
        return file;
    }
    else return (T*) _data->_outputFiles[partNumber];
}